

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CoverpointSymbol::CoverpointSymbol
          (CoverpointSymbol *this,Compilation *comp,string_view name,SourceLocation loc)

{
  Scope *this_00;
  LanguageVersion LVar1;
  Type *fieldType;
  Type *fieldType_00;
  Type *fieldType_01;
  Type *fieldType_02;
  StructBuilder *in_R9;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  StructBuilder type_option;
  StructBuilder option;
  
  (this->super_Symbol).kind = Coverpoint;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  this_00 = &this->super_Scope;
  Scope::Scope(this_00,comp,&this->super_Symbol);
  DeclaredType::DeclaredType
            (&this->declaredType,&this->super_Symbol,(bitmask<slang::ast::DeclaredTypeFlags>)0x4011)
  ;
  (this->options)._M_ptr = (pointer)0x0;
  (this->options)._M_extent._M_extent_value = 0;
  (this->iffExpr).super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = false;
  this->isImplicit = false;
  *(uint *)&(this->declaredType).field_0x3c =
       (*(uint *)&(this->declaredType).field_0x3c & 0xc0000000) + 1;
  fieldType = comp->bitType;
  fieldType_00 = comp->intType;
  fieldType_01 = comp->stringType;
  fieldType_02 = comp->realType;
  LVar1 = (comp->options).languageVersion;
  lookupLocation._12_4_ = 0;
  lookupLocation.scope = (Scope *)0x0;
  lookupLocation.index = 0;
  StructBuilder::StructBuilder(&option,this_00,lookupLocation);
  name_01._M_str = "weight";
  name_01._M_len = 6;
  StructBuilder::addField(&option,name_01,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0);
  name_02._M_str = "goal";
  name_02._M_len = 4;
  StructBuilder::addField(&option,name_02,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0);
  name_03._M_str = "comment";
  name_03._M_len = 7;
  StructBuilder::addField(&option,name_03,fieldType_01,(bitmask<slang::ast::VariableFlags>)0x0);
  name_04._M_str = "at_least";
  name_04._M_len = 8;
  StructBuilder::addField(&option,name_04,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0);
  name_05._M_str = "auto_bin_max";
  name_05._M_len = 0xc;
  StructBuilder::addField(&option,name_05,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x4);
  name_06._M_str = "detect_overlap";
  name_06._M_len = 0xe;
  StructBuilder::addField(&option,name_06,fieldType,(bitmask<slang::ast::VariableFlags>)0x4);
  addProperty((ast *)this_00,(Scope *)0x6,(string_view)ZEXT816(0x43da80),(VariableLifetime)&option,
              in_R9);
  lookupLocation_00._12_4_ = 0;
  lookupLocation_00.scope = (Scope *)0x0;
  lookupLocation_00.index = 0;
  StructBuilder::StructBuilder(&type_option,this_00,lookupLocation_00);
  name_07._M_str = "weight";
  name_07._M_len = 6;
  StructBuilder::addField(&type_option,name_07,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0)
  ;
  name_08._M_str = "goal";
  name_08._M_len = 4;
  StructBuilder::addField(&type_option,name_08,fieldType_00,(bitmask<slang::ast::VariableFlags>)0x0)
  ;
  name_09._M_str = "comment";
  name_09._M_len = 7;
  StructBuilder::addField(&type_option,name_09,fieldType_01,(bitmask<slang::ast::VariableFlags>)0x0)
  ;
  if (0 < (int)LVar1) {
    name_10._M_str = "real_interval";
    name_10._M_len = 0xd;
    StructBuilder::addField
              (&type_option,name_10,fieldType_02,(bitmask<slang::ast::VariableFlags>)0x4);
  }
  name_00._M_str = (char *)0x1;
  name_00._M_len = (size_t)"type_option";
  addProperty((ast *)this_00,(Scope *)0xb,name_00,(VariableLifetime)&type_option,in_R9);
  addBuiltInMethods(this_00,false);
  return;
}

Assistant:

CoverpointSymbol::CoverpointSymbol(Compilation& comp, std::string_view name, SourceLocation loc) :
    Symbol(SymbolKind::Coverpoint, name, loc), Scope(comp, this),
    declaredType(*this, DeclaredTypeFlags::InferImplicit | DeclaredTypeFlags::AutomaticInitializer |
                            DeclaredTypeFlags::CoverageType) {

    // Set the overrideIndex for the type and expression so that they cannot refer to
    // other members of the parent covergroup. This allows coverpoints named the same
    // as formal arguments to not interfere with lookup.
    declaredType.setOverrideIndex(SymbolIndex(1));

    auto& int_t = comp.getIntType();
    auto& bit_t = comp.getBitType();
    auto& string_t = comp.getStringType();
    auto& real_t = comp.getRealType();
    auto lv = comp.languageVersion();

    StructBuilder option(*this, LookupLocation::min);
    option.addField("weight"sv, int_t);
    option.addField("goal"sv, int_t);
    option.addField("comment"sv, string_t);
    option.addField("at_least"sv, int_t);
    option.addField("auto_bin_max"sv, int_t, VariableFlags::ImmutableCoverageOption);
    option.addField("detect_overlap"sv, bit_t, VariableFlags::ImmutableCoverageOption);
    addProperty(*this, "option"sv, VariableLifetime::Automatic, option);

    StructBuilder type_option(*this, LookupLocation::min);
    type_option.addField("weight"sv, int_t);
    type_option.addField("goal"sv, int_t);
    type_option.addField("comment"sv, string_t);
    if (lv >= LanguageVersion::v1800_2023)
        type_option.addField("real_interval"sv, real_t, VariableFlags::ImmutableCoverageOption);
    addProperty(*this, "type_option"sv, VariableLifetime::Static, type_option);

    addBuiltInMethods(*this, false);
}